

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlglvideo.cpp
# Opt level: O1

bool __thiscall SDLGLFB::CanUpdate(SDLGLFB *this)

{
  int iVar1;
  
  iVar1 = this->m_Lock;
  if (1 < iVar1) {
    this->UpdatePending = true;
    this->m_Lock = iVar1 + -1;
  }
  return iVar1 == 1;
}

Assistant:

bool SDLGLFB::CanUpdate ()
{
	if (m_Lock != 1)
	{
		if (m_Lock > 0)
		{
			UpdatePending = true;
			--m_Lock;
		}
		return false;
	}
	return true;
}